

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qloggingregistry.cpp
# Opt level: O3

void __thiscall QLoggingRegistry::setApiRules(QLoggingRegistry *this,QString *content)

{
  __pointer_type copy;
  qsizetype qVar1;
  Data *pDVar2;
  bool bVar3;
  long in_FS_OFFSET;
  Data *pDVar4;
  QStringView content_00;
  QArrayDataPointer<QLoggingRule> local_88;
  QMessageLogger local_68;
  undefined1 local_40 [8];
  QArrayDataPointer<QLoggingRule> local_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_38.d = (Data *)0x0;
  local_38.ptr = (QLoggingRule *)0x0;
  local_38.size = 0;
  local_40 = (undefined1  [8])0xaaaaaaaaaaaaaa01;
  content_00.m_data = (content->d).ptr;
  content_00.m_size = (content->d).size;
  QLoggingSettingsParser::setContent((QLoggingSettingsParser *)local_40,content_00);
  bVar3 = qtLoggingDebug();
  if (bVar3) {
    local_68.context.version = 2;
    local_68.context.line = 0;
    local_68.context.file = (char *)0x0;
    local_68.context.function._0_4_ = 0;
    local_68.context.function._4_4_ = 0;
    local_68.context.category = "qt.core.logging";
    QMessageLogger::debug
              (&local_68,"Loading logging rules set by QLoggingCategory::setFilterRules ...");
  }
  if ((this->registryMutex).super_QBasicMutex.d_ptr._q_value._M_b._M_p == (__pointer_type)0x0) {
    LOCK();
    bVar3 = (this->registryMutex).super_QBasicMutex.d_ptr._q_value._M_b._M_p == (__pointer_type)0x0;
    if (bVar3) {
      (this->registryMutex).super_QBasicMutex.d_ptr._q_value._M_b._M_p = (__pointer_type)0x1;
    }
    UNLOCK();
    if (bVar3) goto LAB_0024b432;
  }
  QBasicMutex::lockInternal((QBasicMutex *)this);
LAB_0024b432:
  if (local_38.d == (Data *)0x0) {
    pDVar4 = (Data *)0x0;
  }
  else {
    LOCK();
    ((local_38.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_38.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
    pDVar4 = local_38.d;
  }
  local_88.d = (Data *)0x0;
  local_88.ptr = (QLoggingRule *)0x0;
  local_88.size = 0;
  pDVar2 = this->ruleSets[2].d.d;
  local_68.context.file = (char *)this->ruleSets[2].d.ptr;
  this->ruleSets[2].d.d = pDVar4;
  this->ruleSets[2].d.ptr = local_38.ptr;
  local_68.context.version = (int)pDVar2;
  local_68.context.line = (int)((ulong)pDVar2 >> 0x20);
  qVar1 = this->ruleSets[2].d.size;
  this->ruleSets[2].d.size = local_38.size;
  local_68.context.function._0_4_ = (undefined4)qVar1;
  local_68.context.function._4_4_ = (undefined4)((ulong)qVar1 >> 0x20);
  QArrayDataPointer<QLoggingRule>::~QArrayDataPointer((QArrayDataPointer<QLoggingRule> *)&local_68);
  QArrayDataPointer<QLoggingRule>::~QArrayDataPointer(&local_88);
  updateRules(this);
  LOCK();
  copy = (this->registryMutex).super_QBasicMutex.d_ptr._q_value._M_b._M_p;
  (this->registryMutex).super_QBasicMutex.d_ptr._q_value._M_b._M_p = (__pointer_type)0x0;
  UNLOCK();
  if (copy != (__pointer_type)0x1) {
    QBasicMutex::unlockInternalFutex((QBasicMutex *)this,copy);
  }
  QArrayDataPointer<QLoggingRule>::~QArrayDataPointer(&local_38);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QLoggingRegistry::setApiRules(const QString &content)
{
    QLoggingSettingsParser parser;
    parser.setImplicitRulesSection(true);
    parser.setContent(content);

    if (qtLoggingDebug())
        debugMsg("Loading logging rules set by QLoggingCategory::setFilterRules ...");

    const QMutexLocker locker(&registryMutex);

    ruleSets[ApiRules] = parser.rules();

    updateRules();
}